

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

mpack_node_t mpack_node_map_at(mpack_node_t node,size_t index,size_t offset)

{
  mpack_tree_error_t p_Var1;
  mpack_error_t mVar2;
  mpack_tree_t *pmVar3;
  mpack_node_data_t *pmVar4;
  mpack_node_t mVar5;
  
  pmVar3 = node.tree;
  pmVar4 = node.data;
  if (pmVar3->error == mpack_ok) {
    if (pmVar4->type == mpack_type_map) {
      if (index < pmVar4->len) {
        pmVar4 = (pmVar4->value).children + index * 2 + offset;
        goto LAB_0010597c;
      }
      pmVar3->error = mpack_error_data;
      p_Var1 = pmVar3->error_fn;
      if (p_Var1 != (mpack_tree_error_t)0x0) {
        mVar2 = mpack_error_data;
        goto LAB_00105976;
      }
    }
    else {
      pmVar3->error = mpack_error_type;
      p_Var1 = pmVar3->error_fn;
      if (p_Var1 != (mpack_tree_error_t)0x0) {
        mVar2 = mpack_error_type;
LAB_00105976:
        (*p_Var1)(pmVar3,mVar2);
      }
    }
  }
  pmVar4 = &pmVar3->nil_node;
LAB_0010597c:
  mVar5.tree = pmVar3;
  mVar5.data = pmVar4;
  return mVar5;
}

Assistant:

MPACK_INLINE mpack_node_t mpack_node_map_at(mpack_node_t node, size_t index, size_t offset) {
    if (mpack_node_error(node) != mpack_ok)
        return mpack_tree_nil_node(node.tree);

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return mpack_tree_nil_node(node.tree);
    }

    if (index >= node.data->len) {
        mpack_node_flag_error(node, mpack_error_data);
        return mpack_tree_nil_node(node.tree);
    }

    return mpack_node(node.tree, mpack_node_child(node, index * 2 + offset));
}